

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

Value * __thiscall Json::Value::resolveReference(Value *this,char *key)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  size_t sVar3;
  ObjectValues *pOVar4;
  iterator __pos;
  _Base_ptr p_Var5;
  CZString actualKey;
  value_type defaultValue;
  undefined1 local_1c0 [32];
  ValueHolder local_1a0;
  uint local_198;
  ValueHolder local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  
  if (*(char *)&this->bits_ == '\0') {
    local_198 = CONCAT22(local_198._2_2_,7);
    local_190.int_ = 0;
    uStack_188 = 0;
    local_180 = 0;
    local_1a0.string_ = (char *)operator_new(0x30);
    p_Var1 = &((local_1a0.map_)->_M_t)._M_impl.super__Rb_tree_header;
    ((local_1a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    ((local_1a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    *(char *)((long)local_1a0 + 0) = '\0';
    *(char *)((long)local_1a0 + 1) = '\0';
    *(char *)((long)local_1a0 + 2) = '\0';
    *(char *)((long)local_1a0 + 3) = '\0';
    *(char *)((long)local_1a0 + 4) = '\0';
    *(char *)((long)local_1a0 + 5) = '\0';
    *(char *)((long)local_1a0 + 6) = '\0';
    *(char *)((long)local_1a0 + 7) = '\0';
    *(undefined8 *)&((local_1a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    ((local_1a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    ((local_1a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    ((local_1a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    swap((Value *)&local_1a0,this);
    ~Value((Value *)&local_1a0);
  }
  else if (*(char *)&this->bits_ != '\a') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0.bool_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.bool_,
               "in Json::Value::resolveReference(): requires objectValue",0x38);
    std::__cxx11::stringbuf::str();
    throwLogicError((String *)local_1c0);
  }
  sVar3 = strlen(key);
  local_1c0._8_4_ = (int)sVar3 << 2;
  pOVar4 = (this->value_).map_;
  p_Var5 = (pOVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  __pos._M_node = &(pOVar4->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_1c0._0_8_ = key;
  if (p_Var5 != (_Base_ptr)0x0) {
    do {
      bVar2 = CZString::operator<((CZString *)(p_Var5 + 1),(CZString *)local_1c0);
      if (!bVar2) {
        __pos._M_node = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[bVar2];
    } while (p_Var5 != (_Base_ptr)0x0);
    pOVar4 = (this->value_).map_;
  }
  if (((_Rb_tree_header *)__pos._M_node == &(pOVar4->_M_t)._M_impl.super__Rb_tree_header) ||
     (bVar2 = CZString::operator==((CZString *)(__pos._M_node + 1),(CZString *)local_1c0), !bVar2))
  {
    nullSingleton();
    std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
              ((pair<const_Json::Value::CZString,_Json::Value> *)&local_1a0,(CZString *)local_1c0,
               &nullSingleton::nullStatic);
    __pos = std::
            _Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
            ::_M_emplace_hint_unique<std::pair<Json::Value::CZString_const,Json::Value>&>
                      ((_Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                        *)(this->value_).map_,__pos._M_node,
                       (pair<const_Json::Value::CZString,_Json::Value> *)&local_1a0);
    ~Value((Value *)&local_190);
    key = (char *)local_1c0._0_8_;
    if ((local_1a0 != (undefined8 *)0x0) && ((local_198 & 3) == 1)) {
      free(local_1a0.string_);
      key = (char *)local_1c0._0_8_;
    }
  }
  if ((key != (char *)0x0) && ((local_1c0._8_4_ & 3) == 1)) {
    free(key);
  }
  return (Value *)&__pos._M_node[1]._M_left;
}

Assistant:

Value& Value::resolveReference(const char* key) {
  JSON_ASSERT_MESSAGE(
      type() == nullValue || type() == objectValue,
      "in Json::Value::resolveReference(): requires objectValue");
  if (type() == nullValue)
    *this = Value(objectValue);
  CZString actualKey(key, static_cast<unsigned>(strlen(key)),
                     CZString::noDuplication); // NOTE!
  auto it = value_.map_->lower_bound(actualKey);
  if (it != value_.map_->end() && (*it).first == actualKey)
    return (*it).second;

  ObjectValues::value_type defaultValue(actualKey, nullSingleton());
  it = value_.map_->insert(it, defaultValue);
  Value& value = (*it).second;
  return value;
}